

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

int check_ecdsa(u8 *Q,u8 *R,u8 *S,u8 *hash,int isSHA256)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 local_138;
  undefined2 uStack_130;
  undefined4 uStack_12e;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined4 uStack_126;
  undefined4 uStack_122;
  undefined4 local_11e;
  u8 Sinv [30];
  u8 r1 [60];
  u8 w2 [30];
  u8 w1 [30];
  u8 r2 [60];
  
  bn_inv(Sinv,S,ec_N,0x1e);
  local_138 = 0;
  uStack_130 = 0;
  uStack_12e = 0;
  uStack_12a = 0;
  if (isSHA256 == 0) {
    local_11e = *(undefined4 *)(hash + 0x10);
    uVar1 = *(undefined8 *)hash;
    uStack_12e = (undefined4)uVar1;
    uStack_12a = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_128 = (undefined2)((ulong)uVar1 >> 0x30);
    uStack_126 = (undefined4)*(undefined8 *)(hash + 8);
    uStack_122 = (undefined4)((ulong)*(undefined8 *)(hash + 8) >> 0x20);
  }
  else {
    bn_shiftr(hash,0x20,7);
    local_138 = *(undefined8 *)hash;
    uVar1 = *(undefined8 *)(hash + 8);
    uStack_128 = (undefined2)((ulong)*(undefined8 *)(hash + 0xe) >> 0x10);
    uStack_126 = (undefined4)((ulong)*(undefined8 *)(hash + 0xe) >> 0x20);
    uStack_122 = (undefined4)*(undefined8 *)(hash + 0x16);
    local_11e = (undefined4)((ulong)*(undefined8 *)(hash + 0x16) >> 0x20);
    uStack_130 = (undefined2)uVar1;
    uStack_12e = (undefined4)((ulong)uVar1 >> 0x10);
    uStack_12a = (undefined2)((ulong)uVar1 >> 0x30);
  }
  bn_mul(w1,(u8 *)&local_138,Sinv,ec_N,0x1e);
  bn_mul(w2,R,Sinv,ec_N,0x1e);
  point_mul(r1,w1,ec_G);
  point_mul(r2,w2,Q);
  point_add(r1,r1,r2);
  iVar2 = bn_compare(r1,ec_N,0x1e);
  if (-1 < iVar2) {
    bn_sub_modulus(r1,ec_N,0x1e);
  }
  iVar2 = bn_compare(r1,R,0x1e);
  return (int)(iVar2 == 0);
}

Assistant:

int check_ecdsa(u8 *Q, u8 *R, u8 *S, u8 *hash, int isSHA256)
{
	u8 Sinv[30];
	u8 e[30];
	u8 w1[30], w2[30];
	u8 r1[60], r2[60];

	bn_inv(Sinv, S, ec_N, 30);

	elt_zero(e);

	if (isSHA256)
	{
		bn_shiftr(hash, 32, 7);  //shift right 7 bits.
		memcpy(e, hash, 30);     //then shift 16 more bits right by cutting off the last two bytes of 32 byte sha256.
    	                         //this gets our bignum sha256 hash to fit in the 233 bit limit of this ecdsa curve.
	}
	else
	{
		// Simon - New addition: added support for SHA1, very insecure as top 80 bits are always zeroes
		memcpy(e + 10, hash, 20);
	}

	bn_mul(w1, e, Sinv, ec_N, 30);
	bn_mul(w2, R, Sinv, ec_N, 30);

	point_mul(r1, w1, ec_G);
	point_mul(r2, w2, Q);

	point_add(r1, r1, r2);

	if (bn_compare(r1, ec_N, 30) >= 0)
		bn_sub_modulus(r1, ec_N, 30);

	return (bn_compare(r1, R, 30) == 0);
}